

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcherData.cpp
# Opt level: O0

void __thiscall ConfusableMatcher::Init(ConfusableMatcher *this)

{
  bool bVar1;
  reference ppVar2;
  size_t local_40;
  unsigned_long x;
  pair<unsigned_long,_unsigned_long> range;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range1;
  ConfusableMatcher *this_local;
  
  __end1 = std::
           vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ::begin(&Ranges);
  range.second = (unsigned_long)
                 std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::end(&Ranges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                                *)&range.second);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::operator*(&__end1);
    range.first = ppVar2->second;
    for (local_40 = ppVar2->first; local_40 <= range.first; local_40 = local_40 + 1) {
      std::bitset<1114110UL>::set(&WordBoundaries,local_40,true);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ConfusableMatcher::Init()
{
	for (auto range : Ranges) {
		for (auto x = range.first;x <= range.second;x++) {
			ConfusableMatcher::WordBoundaries.set(x, true);
		}
	}
}